

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::Image::upload
          (Image *this,VkQueue queue,Allocator *allocator,VkImageLayout layout,VkOffset3D offset,
          int width,int height,int depth,uint mipLevel,uint arrayElement,
          VkImageAspectFlagBits aspect,VkImageType type,void *data)

{
  int *piVar1;
  deInt32 *pdVar2;
  undefined8 obj;
  VkResult VVar3;
  VkExtent3D _extent;
  SharedPtr<vkt::Draw::Image> stagingResource;
  VkCommandBuffer local_1b8;
  long *plStack_1b0;
  deUint32 local_1a8;
  undefined4 uStack_1a4;
  undefined8 uStack_1a0;
  VkSubmitInfo submitInfo;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_140;
  CmdPoolCreateInfo copyCmdPoolCreateInfo;
  CmdBufferBeginInfo beginInfo;
  ImageCreateInfo stagingResourceCreateInfo;
  VkImageAspectFlagBits local_74 [8];
  uint local_54;
  uint local_50;
  undefined4 local_4c;
  undefined8 local_48;
  deInt32 local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  stagingResource.m_ptr = (Image *)0x0;
  stagingResource.m_state = (SharedPtrStateBase *)0x0;
  _extent.height = height;
  _extent.width = width;
  _extent.depth = depth;
  ImageCreateInfo::ImageCreateInfo
            (&stagingResourceCreateInfo,type,this->m_format,_extent,1,1,VK_SAMPLE_COUNT_1_BIT,
             VK_IMAGE_TILING_LINEAR,1,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0,
             VK_IMAGE_LAYOUT_UNDEFINED);
  createAndAlloc((Image *)&submitInfo,this->m_vk,this->m_device,
                 &stagingResourceCreateInfo.super_VkImageCreateInfo,allocator,(MemoryRequirement)0x1
                );
  if (submitInfo.pNext != (void *)0x0) {
    stagingResource.m_ptr = (Image *)submitInfo._0_8_;
    stagingResource.m_state = (SharedPtrStateBase *)submitInfo.pNext;
    if (submitInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)submitInfo.pNext + 8) = *(int *)((long)submitInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      *(int *)((long)submitInfo.pNext + 0xc) = *(int *)((long)submitInfo.pNext + 0xc) + 1;
      UNLOCK();
    }
  }
  if (submitInfo.pNext != (void *)0x0) {
    LOCK();
    piVar1 = (int *)((long)submitInfo.pNext + 8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      submitInfo._4_4_ = 0;
      (**(code **)(*submitInfo.pNext + 0x10))();
    }
    LOCK();
    piVar1 = (int *)((long)submitInfo.pNext + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (submitInfo.pNext != (void *)0x0) {
        (**(code **)(*submitInfo.pNext + 8))();
      }
      submitInfo.pNext = (void *)0x0;
    }
  }
  uploadLinear(stagingResource.m_ptr,(VkOffset3D)ZEXT812(0),width,height,depth,0,0,aspect,data);
  CmdPoolCreateInfo::CmdPoolCreateInfo(&copyCmdPoolCreateInfo,0,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,this->m_vk,this->m_device,
             &copyCmdPoolCreateInfo.super_VkCommandPoolCreateInfo,(VkAllocationCallbacks *)0x0);
  obj = submitInfo._0_8_;
  DStack_140.m_device = (VkDevice)submitInfo._16_8_;
  DStack_140.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,this->m_vk,this->m_device,
             (VkCommandPool)submitInfo._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uStack_1a0 = CONCAT44(submitInfo.pWaitSemaphores._4_4_,submitInfo.pWaitSemaphores._0_4_);
  local_1a8 = submitInfo.waitSemaphoreCount;
  uStack_1a4 = submitInfo._20_4_;
  local_1b8 = (VkCommandBuffer)submitInfo._0_8_;
  plStack_1b0 = (long *)submitInfo.pNext;
  CmdBufferBeginInfo::CmdBufferBeginInfo(&beginInfo,0);
  VVar3 = (*this->m_vk->_vptr_DeviceInterface[0x49])(this->m_vk,local_1b8,&beginInfo);
  ::vk::checkResult(VVar3,"m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x243);
  if (layout == VK_IMAGE_LAYOUT_UNDEFINED) {
    submitInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    submitInfo.pNext = (void *)0x0;
    submitInfo.waitSemaphoreCount = 0;
    submitInfo._20_4_ = 0;
    submitInfo.pWaitSemaphores._0_4_ = 0;
    submitInfo.pWaitSemaphores._4_4_ = 1;
    submitInfo.pWaitDstStageMask._0_4_ = 0xffffffff;
    submitInfo.pWaitDstStageMask._4_4_ = 0xffffffff;
    submitInfo._40_8_ =
         (this->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    submitInfo.pCommandBuffers = (VkCommandBuffer *)(ulong)aspect;
    submitInfo._60_4_ = 0;
    submitInfo.signalSemaphoreCount = this->m_levelCount;
    submitInfo.pSignalSemaphores =
         (VkSemaphore *)CONCAT44(submitInfo.pSignalSemaphores._4_4_,this->m_layerCount);
    layout = VK_IMAGE_LAYOUT_GENERAL;
    (*this->m_vk->_vptr_DeviceInterface[0x6d])
              (this->m_vk,local_1b8,0x8000,1,0,0,0,0,0,1,&submitInfo);
  }
  transition2DImage(this->m_vk,local_1b8,
                    (VkImage)((stagingResource.m_ptr)->m_object).
                             super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,
                    aspect,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,0,0);
  local_74[0] = aspect;
  local_74[1] = 0;
  local_74[2] = 0;
  local_74[3] = 1;
  local_74[4] = 0;
  local_74[5] = 0;
  local_74[6] = 0;
  local_74[7] = aspect;
  local_54 = mipLevel;
  local_50 = arrayElement;
  local_4c = 1;
  local_3c = width;
  local_38 = height;
  local_34 = depth;
  local_48 = offset._0_8_;
  local_40 = offset.z;
  (*this->m_vk->_vptr_DeviceInterface[0x60])
            (this->m_vk,local_1b8,
             ((stagingResource.m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
             m_data.object.m_internal,1,
             (this->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
             ,(ulong)layout,1,local_74);
  VVar3 = (*this->m_vk->_vptr_DeviceInterface[0x4a])(this->m_vk,local_1b8);
  ::vk::checkResult(VVar3,"m_vk.endCommandBuffer(*copyCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x26a);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask._0_4_ = 0;
  submitInfo.pWaitDstStageMask._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = &local_1b8;
  (*this->m_vk->_vptr_DeviceInterface[2])(this->m_vk,queue,1,&submitInfo,0);
  VVar3 = (*this->m_vk->_vptr_DeviceInterface[3])(this->m_vk,queue);
  ::vk::checkResult(VVar3,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x27b);
  if (local_1b8 != (VkCommandBuffer)0x0) {
    submitInfo._0_8_ = local_1b8;
    (**(code **)(*plStack_1b0 + 0x240))(plStack_1b0,_local_1a8,uStack_1a0,1);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_140,(VkCommandPool)obj);
  }
  if (stagingResourceCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(stagingResourceCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)stagingResourceCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)stagingResourceCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (stagingResource.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar2 = &(stagingResource.m_state)->strongRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if (*pdVar2 == 0) {
      (*(stagingResource.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar2 = &(stagingResource.m_state)->weakRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if ((*pdVar2 == 0) && (stagingResource.m_state != (SharedPtrStateBase *)0x0)) {
      (*(stagingResource.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

void Image::upload (vk::VkQueue					queue,
					vk::Allocator&				allocator,
					vk::VkImageLayout			layout,
					vk::VkOffset3D				offset,
					int							width,
					int							height,
					int							depth,
					unsigned int				mipLevel,
					unsigned int				arrayElement,
					vk::VkImageAspectFlagBits	aspect,
					vk::VkImageType				type,
					const void *				data)
{
	DE_ASSERT(layout == vk::VK_IMAGE_LAYOUT_GENERAL || layout == vk::VK_IMAGE_LAYOUT_UNDEFINED || layout == vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);

	de::SharedPtr<Image> stagingResource;
	vk::VkExtent3D extent = {(deUint32)width, (deUint32)height, (deUint32)depth};
	ImageCreateInfo stagingResourceCreateInfo(
		type, m_format, extent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT,
		vk::VK_IMAGE_TILING_LINEAR, vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT);

	stagingResource = Image::createAndAlloc(m_vk, m_device, stagingResourceCreateInfo, allocator,
								vk::MemoryRequirement::HostVisible);

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	stagingResource->uploadLinear(zeroOffset, width, height, depth, 0, 0, aspect, data);

	{
		//todo [scygan] get proper queueFamilyIndex
		CmdPoolCreateInfo copyCmdPoolCreateInfo(0);
		vk::Unique<vk::VkCommandPool> copyCmdPool(vk::createCommandPool(m_vk, m_device, &copyCmdPoolCreateInfo));
		vk::Unique<vk::VkCommandBuffer> copyCmdBuffer(vk::allocateCommandBuffer(m_vk, m_device, *copyCmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		CmdBufferBeginInfo beginInfo;
		VK_CHECK(m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo));

		if (layout == vk::VK_IMAGE_LAYOUT_UNDEFINED)
		{
			layout = vk::VK_IMAGE_LAYOUT_GENERAL;

			vk::VkImageMemoryBarrier barrier;
			barrier.sType = vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
			barrier.pNext = DE_NULL;
			barrier.srcAccessMask = 0;
			barrier.dstAccessMask = 0;
			barrier.oldLayout = vk::VK_IMAGE_LAYOUT_UNDEFINED;
			barrier.newLayout = vk::VK_IMAGE_LAYOUT_GENERAL;
			barrier.srcQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED;
			barrier.dstQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED;
			barrier.image = object();

			barrier.subresourceRange.aspectMask = aspect;
			barrier.subresourceRange.baseMipLevel = 0;
			barrier.subresourceRange.levelCount = m_levelCount;
			barrier.subresourceRange.baseArrayLayer = 0;
			barrier.subresourceRange.layerCount = m_layerCount;

			m_vk.cmdPipelineBarrier(*copyCmdBuffer, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
									0, (const vk::VkMemoryBarrier*)DE_NULL,
									0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
									1, &barrier);
		}

		transition2DImage(m_vk, *copyCmdBuffer, stagingResource->object(), aspect, vk::VK_IMAGE_LAYOUT_UNDEFINED, vk::VK_IMAGE_LAYOUT_GENERAL);

		vk::VkImageCopy region = {{ (vk::VkImageAspectFlags)aspect, 0, 0, 1},
									zeroOffset,
									{ (vk::VkImageAspectFlags)aspect, mipLevel, arrayElement, 1},
									offset,
									{(deUint32)width, (deUint32)height, (deUint32)depth}};

		m_vk.cmdCopyImage(*copyCmdBuffer, stagingResource->object(),
								vk::VK_IMAGE_LAYOUT_GENERAL, object(), layout, 1, &region);
		VK_CHECK(m_vk.endCommandBuffer(*copyCmdBuffer));

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&copyCmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// TODO: make this less intrusive
		VK_CHECK(m_vk.queueWaitIdle(queue));
	}
}